

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void dirty_index_consistency_test(void)

{
  fdb_status fVar1;
  char *__format;
  int iVar2;
  uint uVar3;
  fdb_doc *doc;
  fdb_file_handle *dbfile;
  fdb_iterator *fit;
  fdb_kvs_handle *db [2];
  fdb_doc *rdoc;
  fdb_kvs_config local_350;
  timeval __test_begin;
  char valuebuf [256];
  char keybuf [256];
  fdb_config local_128;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  local_128.buffercache_size = 0;
  local_128.wal_threshold = 100;
  fdb_get_default_kvs_config();
  fVar1 = fdb_open(&dbfile,"dummy",&local_128);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x12bb);
    dirty_index_consistency_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x12bb,"void dirty_index_consistency_test()");
  }
  fVar1 = fdb_kvs_open(dbfile,db,(char *)0x0,&local_350);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x12be);
    dirty_index_consistency_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x12be,"void dirty_index_consistency_test()");
  }
  fVar1 = fdb_kvs_open(dbfile,db + 1,(char *)0x0,&local_350);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x12c1);
    dirty_index_consistency_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x12c1,"void dirty_index_consistency_test()");
  }
  memset(keybuf,0,0x100);
  memset(valuebuf,0,0x100);
  for (uVar3 = 0; uVar3 != 1000; uVar3 = uVar3 + 1) {
    sprintf(keybuf,"k%06d",(ulong)uVar3);
    sprintf(valuebuf,"v%06d",(ulong)uVar3);
    fdb_doc_create(&doc,keybuf,8,(void *)0x0,0,valuebuf,9);
    fVar1 = fdb_set(db[1],doc);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x12cc);
      dirty_index_consistency_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x12cc,"void dirty_index_consistency_test()");
    }
    fdb_doc_free(doc);
  }
  for (uVar3 = 0; uVar3 != 1000; uVar3 = uVar3 + 1) {
    sprintf(keybuf,"k%06d",(ulong)uVar3);
    fdb_doc_create(&doc,keybuf,8,(void *)0x0,0,valuebuf,9);
    fVar1 = fdb_get(db[0],doc);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x12d5);
      dirty_index_consistency_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x12d5,"void dirty_index_consistency_test()");
    }
    fdb_doc_free(doc);
  }
  for (uVar3 = 1000; uVar3 != 3000; uVar3 = uVar3 + 1) {
    sprintf(keybuf,"k%06d",(ulong)uVar3);
    sprintf(valuebuf,"v%06d",(ulong)uVar3);
    fdb_doc_create(&doc,keybuf,8,(void *)0x0,0,valuebuf,9);
    fVar1 = fdb_set(db[1],doc);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x12e0);
      dirty_index_consistency_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x12e0,"void dirty_index_consistency_test()");
    }
    fdb_doc_free(doc);
  }
  fVar1 = fdb_commit(dbfile,'\x01');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x12e6);
    dirty_index_consistency_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x12e6,"void dirty_index_consistency_test()");
  }
  iVar2 = 0;
  fVar1 = fdb_iterator_init(db[1],&fit,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x12ea);
    dirty_index_consistency_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x12ea,"void dirty_index_consistency_test()");
  }
  do {
    rdoc = (fdb_doc *)0x0;
    fVar1 = fdb_iterator_get(fit,&rdoc);
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    iVar2 = iVar2 + 1;
    fdb_doc_free(rdoc);
    fVar1 = fdb_iterator_next(fit);
  } while (fVar1 == FDB_RESULT_SUCCESS);
  fdb_iterator_close(fit);
  if (iVar2 != 3000) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x12f5);
    dirty_index_consistency_test()::__test_pass = 1;
    __assert_fail("r == 3000",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x12f5,"void dirty_index_consistency_test()");
  }
  fVar1 = fdb_close(dbfile);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fdb_shutdown();
    memleak_end();
    __format = "%s PASSED\n";
    if (dirty_index_consistency_test()::__test_pass != '\0') {
      __format = "%s FAILED\n";
    }
    fprintf(_stderr,__format,"dirty index consistency test");
    return;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
          ,0x12f8);
  dirty_index_consistency_test()::__test_pass = 1;
  __assert_fail("s == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x12f8,"void dirty_index_consistency_test()");
}

Assistant:

void dirty_index_consistency_test()
{
    TEST_INIT();
    int i, r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db[2];
    fdb_iterator *fit;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_doc *doc, *rdoc;
    fdb_status s; (void)s;
    char keybuf[256], valuebuf[256];

    memleak_start();

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    config = fdb_get_default_config();
    config.buffercache_size = 0;
    config.wal_threshold = 100;
    kvs_config = fdb_get_default_kvs_config();

    // create a file
    s = fdb_open(&dbfile, "dummy", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(dbfile, &db[0], NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(dbfile, &db[1], NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    memset(keybuf, 0x0, 256);
    memset(valuebuf, 0x0, 256);

    // insert docs & dirty WAL flushing
    for (i=0; i<1000; i++) {
        sprintf(keybuf, "k%06d", i);
        sprintf(valuebuf, "v%06d", i);
        fdb_doc_create(&doc, keybuf, 8, NULL, 0, valuebuf, 9);
        s = fdb_set(db[1], doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }

    // get docks
    for (i=0; i<1000; i++) {
        sprintf(keybuf, "k%06d", i);
        fdb_doc_create(&doc, keybuf, 8, NULL, 0, valuebuf, 9);
        s = fdb_get(db[0], doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    // now dirty blocks are cached in db[0]'s (default) bhandle

    // more dirty WAL flushing
    for (i=1000; i<3000; i++) {
        sprintf(keybuf, "k%06d", i);
        sprintf(valuebuf, "v%06d", i);
        fdb_doc_create(&doc, keybuf, 8, NULL, 0, valuebuf, 9);
        s = fdb_set(db[1], doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }

    // commit - WAL flushing is executed on the default handle
    s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // count # docs
    s = fdb_iterator_init(db[1], &fit, NULL, 0, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    r = 0;
    do {
        rdoc = NULL;
        s = fdb_iterator_get(fit, &rdoc);
        if (s != FDB_RESULT_SUCCESS) break;
        r++;
        fdb_doc_free(rdoc);
    } while (fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
    fdb_iterator_close(fit);

    TEST_CHK(r == 3000);

    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    fdb_shutdown();
    memleak_end();

    TEST_RESULT("dirty index consistency test");
}